

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

void N_VDestroyVectorArray(N_Vector *vs,int count)

{
  int in_ESI;
  void *in_RDI;
  int j;
  undefined4 local_10;
  
  if (in_RDI != (void *)0x0) {
    for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
      N_VDestroy((N_Vector)0xecca0c);
      *(undefined8 *)((long)in_RDI + (long)local_10 * 8) = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void N_VDestroyVectorArray(N_Vector* vs, int count)
{
  int j;

  if (vs == NULL) return;

  for (j = 0; j < count; j++) {
    N_VDestroy(vs[j]);
    vs[j] = NULL;
  }

  free(vs); vs = NULL;

  return;
}